

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapEntry<int,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::~MapEntry(MapEntry<int,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~MapEntry() PROTOBUF_OVERRIDE {
    // Make sure that `Value` is never a derived message type.
    // We don't want to instantiate the template with every unique derived type.
    // The assertion is in the destructor because we need `Value` to be
    // complete to test it.
    static_assert(!std::is_base_of<Message, Value>::value ||
                      std::is_same<Message, Value>::value,
                  "");

    if (GetArena() != nullptr) return;
    SharedDtor(*this);
  }